

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O0

void __thiscall
gl4cts::ShaderSubroutine::FunctionalTest7_8::calculate
          (FunctionalTest7_8 *this,GLuint *combination,vec4<float> *left,vec4<float> *right,
          vec4<unsigned_int> *indices,vec4<float> *out_combined,vec4<float> *out_combined_inverted,
          vec4<float> *out_constant,vec4<float> *out_constant_inverted,vec4<float> *out_dynamic,
          vec4<float> *out_dynamic_inverted,vec4<float> *out_loop)

{
  GLuint function_00;
  GLuint function_01;
  GLuint function_02;
  GLuint function_03;
  GLuint dynamic_function_inverted;
  GLuint dynamic_function;
  GLuint function_inverted;
  GLuint function;
  GLuint i;
  vec4<float> dynamic_inverted;
  vec4<float> dynamic;
  vec4<float> constant_inverted;
  vec4<float> constant;
  vec4<float> combined_inverted;
  vec4<float> combined;
  vec4<float> constant_values [5];
  GLuint dynamic_combination [4];
  vec4<float> *out_combined_local;
  vec4<unsigned_int> *indices_local;
  vec4<float> *right_local;
  vec4<float> *left_local;
  GLuint *combination_local;
  FunctionalTest7_8 *this_local;
  
  constant_values[4].m_z = (float)combination[indices->m_x];
  constant_values[4].m_w = (float)combination[indices->m_y];
  Utils::vec4<float>::vec4((vec4<float> *)&combined.m_z,1.0,2.0,3.0,4.0);
  Utils::vec4<float>::vec4((vec4<float> *)&constant_values[0].m_z,-5.0,-6.0,-7.0,-8.0);
  Utils::vec4<float>::vec4((vec4<float> *)&constant_values[1].m_z,-1.0,-2.0,-3.0,-4.0);
  Utils::vec4<float>::vec4((vec4<float> *)&constant_values[2].m_z,5.0,6.0,7.0,8.0);
  Utils::vec4<float>::vec4((vec4<float> *)&constant_values[3].m_z,1.0,2.0,3.0,4.0);
  combined_inverted.m_z = left->m_x;
  combined_inverted.m_w = left->m_y;
  combined.m_x = left->m_z;
  combined.m_y = left->m_w;
  constant.m_z = left->m_x;
  constant.m_w = left->m_y;
  combined_inverted.m_x = left->m_z;
  combined_inverted.m_y = left->m_w;
  constant_inverted.m_z = combined.m_z;
  constant_inverted.m_w = combined.m_w;
  constant.m_x = constant_values[0].m_x;
  constant.m_y = constant_values[0].m_y;
  dynamic.m_z = combined.m_z;
  dynamic.m_w = combined.m_w;
  constant_inverted.m_x = constant_values[0].m_x;
  constant_inverted.m_y = constant_values[0].m_y;
  dynamic_inverted.m_z = left->m_x;
  dynamic_inverted.m_w = left->m_y;
  dynamic.m_x = left->m_z;
  dynamic.m_y = left->m_w;
  function = (GLuint)left->m_x;
  i = (GLuint)left->m_y;
  dynamic_inverted.m_x = left->m_z;
  dynamic_inverted.m_y = left->m_w;
  for (function_inverted = 0; function_inverted < 4; function_inverted = function_inverted + 1) {
    function_00 = combination[function_inverted];
    function_01 = combination[3 - function_inverted];
    function_02 = dynamic_combination[(ulong)function_inverted - 2];
    function_03 = dynamic_combination[(ulong)(3 - function_inverted) - 2];
    calculate(this,function_00,(vec4<float> *)&combined_inverted.m_z,right,
              (vec4<float> *)&combined_inverted.m_z);
    calculate(this,function_01,(vec4<float> *)&constant.m_z,right,(vec4<float> *)&constant.m_z);
    calculate(this,function_00,(vec4<float> *)&constant_inverted.m_z,
              (vec4<float> *)&constant_values[(ulong)(function_inverted + 1) - 1].m_z,
              (vec4<float> *)&constant_inverted.m_z);
    calculate(this,function_01,(vec4<float> *)&dynamic.m_z,
              (vec4<float> *)&constant_values[(ulong)(function_inverted + 1) - 1].m_z,
              (vec4<float> *)&dynamic.m_z);
    calculate(this,function_02,(vec4<float> *)&dynamic_inverted.m_z,right,
              (vec4<float> *)&dynamic_inverted.m_z);
    calculate(this,function_03,(vec4<float> *)&function,right,(vec4<float> *)&function);
  }
  out_combined->m_x = combined_inverted.m_z;
  out_combined->m_y = combined_inverted.m_w;
  out_combined->m_z = combined.m_x;
  out_combined->m_w = combined.m_y;
  out_combined_inverted->m_x = constant.m_z;
  out_combined_inverted->m_y = constant.m_w;
  out_combined_inverted->m_z = combined_inverted.m_x;
  out_combined_inverted->m_w = combined_inverted.m_y;
  out_constant->m_x = constant_inverted.m_z;
  out_constant->m_y = constant_inverted.m_w;
  out_constant->m_z = constant.m_x;
  out_constant->m_w = constant.m_y;
  out_constant_inverted->m_x = dynamic.m_z;
  out_constant_inverted->m_y = dynamic.m_w;
  out_constant_inverted->m_z = constant_inverted.m_x;
  out_constant_inverted->m_w = constant_inverted.m_y;
  out_dynamic->m_x = dynamic_inverted.m_z;
  out_dynamic->m_y = dynamic_inverted.m_w;
  out_dynamic->m_z = dynamic.m_x;
  out_dynamic->m_w = dynamic.m_y;
  out_dynamic_inverted->m_x = (float)function;
  out_dynamic_inverted->m_y = (float)i;
  out_dynamic_inverted->m_z = dynamic_inverted.m_x;
  out_dynamic_inverted->m_w = dynamic_inverted.m_y;
  out_loop->m_x = combined_inverted.m_z;
  out_loop->m_y = combined_inverted.m_w;
  out_loop->m_z = combined.m_x;
  out_loop->m_w = combined.m_y;
  return;
}

Assistant:

void FunctionalTest7_8::calculate(
	const glw::GLuint combination[4], const Utils::vec4<glw::GLfloat>& left, const Utils::vec4<glw::GLfloat>& right,
	const Utils::vec4<glw::GLuint>& indices, Utils::vec4<glw::GLfloat>& out_combined,
	Utils::vec4<glw::GLfloat>& out_combined_inverted, Utils::vec4<glw::GLfloat>& out_constant,
	Utils::vec4<glw::GLfloat>& out_constant_inverted, Utils::vec4<glw::GLfloat>& out_dynamic,
	Utils::vec4<glw::GLfloat>& out_dynamic_inverted, Utils::vec4<glw::GLfloat>& out_loop) const
{
	/* Indices used by "dynamic" operations, range <0..4> */
	const GLuint dynamic_combination[4] = { combination[indices.m_x], combination[indices.m_y],
											combination[indices.m_z], combination[indices.m_w] };

	/* Values used by "constant" operations, come from shader code */
	const Utils::vec4<glw::GLfloat> constant_values[] = { Utils::vec4<glw::GLfloat>(1, 2, 3, 4),
														  Utils::vec4<glw::GLfloat>(-5, -6, -7, -8),
														  Utils::vec4<glw::GLfloat>(-1, -2, -3, -4),
														  Utils::vec4<glw::GLfloat>(5, 6, 7, 8),
														  Utils::vec4<glw::GLfloat>(1, 2, 3, 4) };

	/* Start values */
	Utils::vec4<glw::GLfloat> combined			= left;
	Utils::vec4<glw::GLfloat> combined_inverted = left;
	Utils::vec4<glw::GLfloat> constant			= constant_values[0];
	Utils::vec4<glw::GLfloat> constant_inverted = constant_values[0];
	Utils::vec4<glw::GLfloat> dynamic			= left;
	Utils::vec4<glw::GLfloat> dynamic_inverted  = left;

	/* Calculate expected results */
	for (GLuint i = 0; i < 4; ++i)
	{
		GLuint function					 = combination[i];
		GLuint function_inverted		 = combination[3 - i];
		GLuint dynamic_function			 = dynamic_combination[i];
		GLuint dynamic_function_inverted = dynamic_combination[3 - i];

		calculate(function, combined, right, combined);
		calculate(function_inverted, combined_inverted, right, combined_inverted);
		calculate(function, constant, constant_values[i + 1], constant);
		calculate(function_inverted, constant_inverted, constant_values[i + 1], constant_inverted);
		calculate(dynamic_function, dynamic, right, dynamic);
		calculate(dynamic_function_inverted, dynamic_inverted, right, dynamic_inverted);
	}

	/* Store results */
	out_combined		  = combined;
	out_combined_inverted = combined_inverted;
	out_constant		  = constant;
	out_constant_inverted = constant_inverted;
	out_dynamic			  = dynamic;
	out_dynamic_inverted  = dynamic_inverted;
	out_loop			  = combined;
}